

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void __thiscall
CodeGenGenericContext::KillLateUnreadRegVmRegisters
          (CodeGenGenericContext *this,uchar *instRegKillInfo)

{
  byte bVar1;
  uint local_28;
  uint k;
  uint postKillCount;
  uint preKillCount;
  uint regKillCounts;
  uchar *instRegKillInfo_local;
  CodeGenGenericContext *this_local;
  
  bVar1 = *instRegKillInfo;
  if (bVar1 != 0) {
    _preKillCount = instRegKillInfo + (ulong)(bVar1 >> 4) + 1;
    for (local_28 = 0; local_28 < (bVar1 & 0xf); local_28 = local_28 + 1) {
      KillUnreadRegVmRegister(this,*_preKillCount);
      _preKillCount = _preKillCount + 1;
    }
  }
  return;
}

Assistant:

void CodeGenGenericContext::KillLateUnreadRegVmRegisters(unsigned char *instRegKillInfo)
{
	if(unsigned regKillCounts = *instRegKillInfo)
	{
		instRegKillInfo++;

		unsigned preKillCount = (regKillCounts >> 4);
		unsigned postKillCount = (regKillCounts & 0xf);

		instRegKillInfo += preKillCount;

		for(unsigned k = 0; k < postKillCount; k++)
			KillUnreadRegVmRegister(*instRegKillInfo++);
	}
}